

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O3

curltime Curl_now(void)

{
  curltime cVar1;
  timeval now;
  undefined1 local_18 [12];
  
  gettimeofday((timeval *)local_18,(__timezone_ptr_t)0x0);
  cVar1._12_4_ = 0;
  cVar1.tv_sec = local_18._0_8_;
  cVar1.tv_usec = local_18._8_4_;
  return cVar1;
}

Assistant:

struct curltime Curl_now(void)
{
  /*
  ** gettimeofday() is not granted to be increased monotonically, due to
  ** clock drifting and external source time synchronization it can jump
  ** forward or backward in time.
  */
  struct timeval now;
  struct curltime ret;
  (void)gettimeofday(&now, NULL);
  ret.tv_sec = now.tv_sec;
  ret.tv_usec = (int)now.tv_usec;
  return ret;
}